

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int jx9Builtin_strrchr(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_value *pValue;
  int iVar1;
  undefined8 in_RAX;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  int nLen;
  int local_24;
  
  local_24 = (int)((ulong)in_RAX >> 0x20);
  if ((1 < nArg) && (pcVar2 = jx9_value_to_string(*apArg,&local_24), 0 < local_24)) {
    pValue = apArg[1];
    if ((pValue->iFlags & 1) == 0) {
      iVar1 = jx9_value_to_int(pValue);
    }
    else {
      pcVar3 = jx9_value_to_string(pValue,(int *)0x0);
      iVar1 = (int)*pcVar3;
    }
    for (pcVar3 = pcVar2 + ((ulong)(local_24 - 1) - 1); pcVar4 = pcVar3 + 1, pcVar2 <= pcVar4;
        pcVar3 = pcVar3 + -4) {
      if (iVar1 == *pcVar4) {
LAB_0012bedc:
        jx9_result_string(pCtx,pcVar2 + ((long)pcVar4 - (long)pcVar2 & 0xffffffff),
                          local_24 - (int)((long)pcVar4 - (long)pcVar2));
        return 0;
      }
      if (pcVar3 < pcVar2) break;
      pcVar4 = pcVar3;
      if (iVar1 == *pcVar3) goto LAB_0012bedc;
      pcVar4 = pcVar3 + -1;
      if (pcVar4 < pcVar2) break;
      if (iVar1 == *pcVar4) goto LAB_0012bedc;
      pcVar4 = pcVar3 + -2;
      if (pcVar4 < pcVar2) break;
      if (iVar1 == *pcVar4) goto LAB_0012bedc;
    }
  }
  jx9_result_bool(pCtx,0);
  return 0;
}

Assistant:

static int jx9Builtin_strrchr(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zBlob;
	int nLen, c;
	if( nArg < 2 ){
		/* Missing arguments, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the haystack */
	zBlob = jx9_value_to_string(apArg[0], &nLen);
	c = 0; /* cc warning */
	if( nLen > 0 ){
		sxu32 nOfft;
		sxi32 rc;
		if( jx9_value_is_string(apArg[1]) ){
			const char *zPattern;
			zPattern = jx9_value_to_string(apArg[1], 0); /* Never fail, so there is no need to check
														 * for NULL pointer.
														 */
			c = zPattern[0];
		}else{
			/* Int cast */
			c = jx9_value_to_int(apArg[1]);
		}
		/* Perform the lookup */
		rc = SyByteFind2(zBlob, (sxu32)nLen, c, &nOfft);
		if( rc != SXRET_OK ){
			/* No such entry, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Return the string portion */
		jx9_result_string(pCtx, &zBlob[nOfft], (int)(&zBlob[nLen]-&zBlob[nOfft]));
	}else{
		jx9_result_bool(pCtx, 0);
	}
	return JX9_OK;
}